

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::CheckRuleHashes(cmGlobalGenerator *this)

{
  pointer pcVar1;
  string *psVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string pfile;
  string home;
  string local_78;
  string local_58;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined8 local_28;
  char *local_20;
  
  psVar2 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + psVar2->_M_string_length);
  local_38._M_len = local_58._M_string_length;
  local_38._M_str = local_58._M_dataplus._M_p;
  local_28 = 0x1f;
  local_20 = "/CMakeFiles/CMakeRuleHashes.txt";
  views._M_len = 2;
  views._M_array = &local_38;
  cmCatViews_abi_cxx11_(&local_78,views);
  CheckRuleHashes(this,&local_78,&local_58);
  WriteRuleHashes(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CheckRuleHashes()
{
#if !defined(CMAKE_BOOTSTRAP)
  std::string home = this->GetCMakeInstance()->GetHomeOutputDirectory();
  std::string pfile = cmStrCat(home, "/CMakeFiles/CMakeRuleHashes.txt");
  this->CheckRuleHashes(pfile, home);
  this->WriteRuleHashes(pfile);
#endif
}